

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norms.cpp
# Opt level: O3

void __thiscall
icu_63::Decomposer::rangeHandler(Decomposer *this,UChar32 start,UChar32 end,Norm *norm)

{
  byte bVar1;
  ushort uVar2;
  char16_t cVar3;
  MappingType MVar4;
  Norms *pNVar5;
  Norm *pNVar6;
  UnicodeString *pUVar7;
  short sVar8;
  uint32_t uVar9;
  uint uVar10;
  UChar32 c;
  long lVar11;
  UnicodeString *pUVar12;
  undefined8 extraout_RAX;
  uint uVar13;
  int32_t iVar14;
  int srcLength;
  int c_00;
  Decomposer *this_00;
  uint uVar15;
  Decomposer *pDVar16;
  char16_t *pcVar17;
  int32_t iVar18;
  Norm *pNVar19;
  UChar buffer [3];
  int local_88;
  UChar local_7e;
  short local_7c;
  short local_7a;
  UnicodeString *local_78;
  Decomposer *local_70;
  Norm *local_68;
  UnicodeString *local_60;
  int local_54;
  Norm *local_50;
  UChar *local_48;
  char16_t *local_38;
  
  if (1 < (int)norm->mappingType) {
    local_78 = norm->mapping;
    uVar2 = (local_78->fUnion).fStackFields.fLengthAndFlags;
    if ((uVar2 & 0x11) == 0) {
      if ((uVar2 & 2) == 0) {
        pcVar17 = (local_78->fUnion).fFields.fArray;
      }
      else {
        pcVar17 = (char16_t *)((long)&local_78->fUnion + 2);
      }
    }
    else {
      pcVar17 = (char16_t *)0x0;
    }
    sVar8 = (local_78->fUnion).fStackFields.fLengthAndFlags;
    if (sVar8 < 0) {
      iVar18 = (local_78->fUnion).fFields.fLength;
    }
    else {
      iVar18 = (int)sVar8 >> 5;
    }
    if (0 < iVar18) {
      pUVar12 = (UnicodeString *)0x0;
      srcLength = 0;
      local_70 = this;
      local_68 = norm;
      local_54 = end;
      local_38 = pcVar17;
      do {
        local_88 = srcLength + 1;
        cVar3 = pcVar17[srcLength];
        this_00 = (Decomposer *)(ulong)(ushort)cVar3;
        if ((((cVar3 & 0xfc00U) == 0xd800) && (local_88 != iVar18)) &&
           (lVar11 = (long)local_88, ((ushort)pcVar17[lVar11] & 0xfc00) == 0xdc00)) {
          local_88 = srcLength + 2;
          this_00 = (Decomposer *)
                    (ulong)((uint)(ushort)cVar3 * 0x400 + (uint)(ushort)pcVar17[lVar11] + 0xfca02400
                           );
        }
        c_00 = (int)this_00;
        local_60 = pUVar12;
        if (c_00 <= local_54 && start <= c_00) {
          rangeHandler(this_00);
LAB_001e04e5:
          fprintf(_stderr,
                  "gennorm2 error: U+%04lX\'s round-trip mapping\'s starter U+%04lX decomposes and the inner/earlier tccc=%hu > outer/following tccc=%hu, not possible in Unicode normalization\n"
                  ,(long)start,this_00);
          exit(3);
        }
        pNVar5 = (local_70->super_Enumerator).norms;
        pNVar19 = pNVar5->norms;
        pDVar16 = this_00;
        uVar9 = umutablecptrie_get_63(pNVar5->normTrie,c_00);
        pUVar12 = local_60;
        MVar4 = pNVar19[uVar9].mappingType;
        if ((int)MVar4 < 2) {
          uVar10 = c_00 - 0xac00;
          if (uVar10 < 0x2ba4) {
            uVar13 = (uVar10 & 0xffff) >> 2;
            uVar15 = (uVar10 & 0xffff) / 0x24c | 0x1100;
            local_7e = (UChar)uVar15;
            local_7c = (short)(uVar13 / 7) + (short)((uVar13 / 7) / 0x15) * -0x15 + 0x1161;
            sVar8 = (short)uVar10 - ((short)(uVar13 / 7) * 0x1b + (short)(uVar13 / 7));
            if (sVar8 == 0) {
              iVar14 = 2;
            }
            else {
              local_7a = sVar8 + 0x11a7;
              iVar14 = 3;
            }
            if ((srcLength != 0) && (local_68->mappingType == ROUND_TRIP)) {
              rangeHandler();
LAB_001e051c:
              rangeHandler();
LAB_001e0527:
              pDVar16 = this_00;
              rangeHandler();
              UMemory::operator_delete((UMemory *)this_00,pDVar16);
              _Unwind_Resume(extraout_RAX);
            }
            if (local_60 == (UnicodeString *)0x0) {
              pUVar12 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(ulong)uVar15);
              UnicodeString::UnicodeString(pUVar12,local_78,0,srcLength);
            }
            UnicodeString::doAppend(pUVar12,&local_7e,0,iVar14);
            local_48 = &local_7e;
          }
          else if (local_60 == (UnicodeString *)0x0) {
            pUVar12 = (UnicodeString *)0x0;
          }
          else {
            UnicodeString::doAppend(local_60,local_78,srcLength,local_88 - srcLength);
          }
        }
        else {
          pNVar19 = pNVar19 + uVar9;
          if (local_68->mappingType == ROUND_TRIP) {
            if (srcLength != 0) goto LAB_001e051c;
            if (MVar4 != ROUND_TRIP) goto LAB_001e0527;
            pNVar5 = (local_70->super_Enumerator).norms;
            c = UnicodeString::char32At(local_78,local_88);
            pNVar6 = pNVar5->norms;
            uVar9 = umutablecptrie_get_63(pNVar5->normTrie,c);
            pUVar12 = pNVar19->mapping;
            sVar8 = (pUVar12->fUnion).fStackFields.fLengthAndFlags;
            if (sVar8 < 0) {
              iVar14 = (pUVar12->fUnion).fFields.fLength;
            }
            else {
              iVar14 = (int)sVar8 >> 5;
            }
            bVar1 = pNVar6[uVar9].cc;
            uVar10 = UnicodeString::char32At(pUVar12,iVar14 + -1);
            pNVar5 = (local_70->super_Enumerator).norms;
            local_50 = pNVar5->norms;
            pDVar16 = (Decomposer *)(ulong)uVar10;
            uVar9 = umutablecptrie_get_63(pNVar5->normTrie,uVar10);
            if (bVar1 < local_50[uVar9].cc) goto LAB_001e04e5;
          }
          pUVar12 = local_60;
          if (local_60 == (UnicodeString *)0x0) {
            pUVar12 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pDVar16);
            UnicodeString::UnicodeString(pUVar12,local_78,0,srcLength);
          }
          pUVar7 = pNVar19->mapping;
          sVar8 = (pUVar7->fUnion).fStackFields.fLengthAndFlags;
          if (sVar8 < 0) {
            iVar14 = (pUVar7->fUnion).fFields.fLength;
          }
          else {
            iVar14 = (int)sVar8 >> 5;
          }
          UnicodeString::doAppend(pUVar12,pUVar7,0,iVar14);
        }
        pNVar19 = local_68;
        srcLength = local_88;
      } while (local_88 < iVar18);
      if (pUVar12 != (UnicodeString *)0x0) {
        pUVar7 = local_68->mapping;
        if (local_68->rawMapping == (UnicodeString *)0x0) {
          local_68->rawMapping = pUVar7;
        }
        else if (pUVar7 != (UnicodeString *)0x0) {
          (*(pUVar7->super_Replaceable).super_UObject._vptr_UObject[1])();
        }
        pNVar19->mapping = pUVar12;
        local_70->didDecompose = local_70->didDecompose | 1;
      }
    }
  }
  return;
}

Assistant:

void Decomposer::rangeHandler(UChar32 start, UChar32 end, Norm &norm) {
    if(!norm.hasMapping()) { return; }
    const UnicodeString &m=*norm.mapping;
    UnicodeString *decomposed=nullptr;
    const UChar *s=toUCharPtr(m.getBuffer());
    int32_t length=m.length();
    int32_t prev, i=0;
    UChar32 c;
    while(i<length) {
        prev=i;
        U16_NEXT(s, i, length, c);
        if(start<=c && c<=end) {
            fprintf(stderr,
                    "gennorm2 error: U+%04lX maps to itself directly or indirectly\n",
                    (long)c);
            exit(U_INVALID_FORMAT_ERROR);
        }
        const Norm &cNorm=norms.getNormRef(c);
        if(cNorm.hasMapping()) {
            if(norm.mappingType==Norm::ROUND_TRIP) {
                if(prev==0) {
                    if(cNorm.mappingType!=Norm::ROUND_TRIP) {
                        fprintf(stderr,
                                "gennorm2 error: "
                                "U+%04lX's round-trip mapping's starter "
                                "U+%04lX one-way-decomposes, "
                                "not possible in Unicode normalization\n",
                                (long)start, (long)c);
                        exit(U_INVALID_FORMAT_ERROR);
                    }
                    uint8_t myTrailCC=norms.getCC(m.char32At(i));
                    UChar32 cTrailChar=cNorm.mapping->char32At(cNorm.mapping->length()-1);
                    uint8_t cTrailCC=norms.getCC(cTrailChar);
                    if(cTrailCC>myTrailCC) {
                        fprintf(stderr,
                                "gennorm2 error: "
                                "U+%04lX's round-trip mapping's starter "
                                "U+%04lX decomposes and the "
                                "inner/earlier tccc=%hu > outer/following tccc=%hu, "
                                "not possible in Unicode normalization\n",
                                (long)start, (long)c,
                                (short)cTrailCC, (short)myTrailCC);
                        exit(U_INVALID_FORMAT_ERROR);
                    }
                } else {
                    fprintf(stderr,
                            "gennorm2 error: "
                            "U+%04lX's round-trip mapping's non-starter "
                            "U+%04lX decomposes, "
                            "not possible in Unicode normalization\n",
                            (long)start, (long)c);
                    exit(U_INVALID_FORMAT_ERROR);
                }
            }
            if(decomposed==nullptr) {
                decomposed=new UnicodeString(m, 0, prev);
            }
            decomposed->append(*cNorm.mapping);
        } else if(Hangul::isHangul(c)) {
            UChar buffer[3];
            int32_t hangulLength=Hangul::decompose(c, buffer);
            if(norm.mappingType==Norm::ROUND_TRIP && prev!=0) {
                fprintf(stderr,
                        "gennorm2 error: "
                        "U+%04lX's round-trip mapping's non-starter "
                        "U+%04lX decomposes, "
                        "not possible in Unicode normalization\n",
                        (long)start, (long)c);
                exit(U_INVALID_FORMAT_ERROR);
            }
            if(decomposed==nullptr) {
                decomposed=new UnicodeString(m, 0, prev);
            }
            decomposed->append(buffer, hangulLength);
        } else if(decomposed!=nullptr) {
            decomposed->append(m, prev, i-prev);
        }
    }
    if(decomposed!=nullptr) {
        if(norm.rawMapping==nullptr) {
            // Remember the original mapping when decomposing recursively.
            norm.rawMapping=norm.mapping;
        } else {
            delete norm.mapping;
        }
        norm.mapping=decomposed;
        // Not  norm.setMappingCP();  because the original mapping
        // is most likely to be encodable as a delta.
        didDecompose|=TRUE;
    }
}